

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_hello_decode_key_share
              (ptls_key_exchange_algorithm_t **selected_group,ptls_iovec_t *selected_key,
              ptls_key_exchange_algorithm_t **candidates,uint8_t *src,uint8_t *end)

{
  int iVar1;
  uint8_t *puVar2;
  long *local_70;
  ptls_key_exchange_algorithm_t **c;
  ptls_iovec_t key;
  uint16_t group;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_key_exchange_algorithm_t **candidates_local;
  ptls_iovec_t *selected_key_local;
  ptls_key_exchange_algorithm_t **selected_group_local;
  
  _block_size = 2;
  if ((ulong)((long)end - (long)src) < 2) {
    _capacity._4_4_ = 0x32;
  }
  else {
    end_1 = (uint8_t *)0x0;
    end_local = src;
    do {
      puVar2 = end_local + 1;
      end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
      _block_size = _block_size - 1;
      end_local = puVar2;
    } while (_block_size != 0);
    if (end + -(long)puVar2 < end_1) {
      _capacity._4_4_ = 0x32;
    }
    else {
      puVar2 = puVar2 + (long)end_1;
      src_local = (uint8_t *)candidates;
      candidates_local = (ptls_key_exchange_algorithm_t **)selected_key;
      selected_key_local = (ptls_iovec_t *)selected_group;
LAB_00119fc8:
      _capacity._4_4_ = 0;
      if (end_local != puVar2) {
        iVar1 = decode_key_share_entry
                          ((uint16_t *)((long)&key.len + 6),(ptls_iovec_t *)&c,&end_local,puVar2);
        if (iVar1 != 0) {
          return iVar1;
        }
        if (selected_key_local->base == (uint8_t *)0x0) {
          for (local_70 = (long *)src_local; *local_70 != 0; local_70 = local_70 + 1) {
            if (*(short *)*local_70 == key.len._6_2_) {
              selected_key_local->base = (uint8_t *)*local_70;
              *candidates_local = (ptls_key_exchange_algorithm_t *)c;
              candidates_local[1] = (ptls_key_exchange_algorithm_t *)key.base;
              break;
            }
          }
        }
        goto LAB_00119fc8;
      }
      if (end_local == puVar2) {
        if (end_local != end) {
          _capacity._4_4_ = 0x32;
        }
      }
      else {
        _capacity._4_4_ = 0x32;
      }
    }
  }
  return _capacity._4_4_;
}

Assistant:

static int client_hello_decode_key_share(ptls_key_exchange_algorithm_t **selected_group, ptls_iovec_t *selected_key,
                                         ptls_key_exchange_algorithm_t **candidates, const uint8_t *src, const uint8_t *end)
{
    int ret = 0;

    decode_block(src, end, 2, {
        while (src != end) {
            uint16_t group;
            ptls_iovec_t key;
            if ((ret = decode_key_share_entry(&group, &key, &src, end)) != 0)
                goto Exit;
            if (*selected_group == NULL) {
                ptls_key_exchange_algorithm_t **c = candidates;
                for (; *c != NULL; ++c) {
                    if ((*c)->id == group) {
                        *selected_group = *c;
                        *selected_key = key;
                        break;
                    }
                }
            }
        }
    });

Exit:
    return ret;
}